

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearPosition.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearPosition::ArchiveIN(ChLinkMotorLinearPosition *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMotorLinearPosition>(marchive);
  ChLinkMotorLinear::ArchiveIN(&this->super_ChLinkMotorLinear,marchive);
  local_28._value = (double *)&(this->super_ChLinkMotorLinear).field_0x278;
  local_28._name = "pos_offset";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChLinkMotorLinearPosition::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotorLinearPosition>();

    // deserialize parent class
    ChLinkMotorLinear::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(pos_offset);
}